

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::StructuredAssignmentPatternExpression::forDynamicArray
          (Compilation *comp,StructuredAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Type *elementType,SourceRange sourceRange)

{
  char *pcVar1;
  undefined4 uVar2;
  size_t sVar3;
  SyntaxNode *this;
  int iVar4;
  undefined1 auVar5 [16];
  Compilation *compilation;
  bool bVar6;
  int iVar7;
  AssignmentPatternItemSyntax *pAVar8;
  undefined4 extraout_var;
  optional<int> value;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  StructuredAssignmentPatternExpression *expr_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  ulong pos0;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src_00;
  StructuredAssignmentPatternExpression *ctx;
  ulong hash;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  pair<const_int,_const_slang::ast::Expression_*> *ppVar12;
  uint uVar13;
  size_t i;
  ulong uVar14;
  EVP_PKEY_CTX *unaff_R15;
  undefined7 uVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  SourceRange SVar21;
  EVP_PKEY_CTX *local_218;
  ulong local_210;
  span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  local_208;
  mapped_type expr;
  __extent_storage<18446744073709551615UL> _Stack_1f0;
  undefined1 local_1e8 [16];
  pair<const_int,_const_slang::ast::Expression_*> *local_1d8;
  StructuredAssignmentPatternExpression *local_1c8;
  Compilation *local_1c0;
  Type *local_1b8;
  void *local_1b0;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_1a8;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  indexMap;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL> indexSetters;
  Expression *this_00;
  
  local_1c8 = (StructuredAssignmentPatternExpression *)type;
  local_1c0 = comp;
  local_1b8 = elementType;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  ::SmallMap(&indexMap);
  indexSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
  .data_ = (pointer)indexSetters.
                    super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                    .firstElement;
  indexSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
  .len = 0;
  indexSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
  .cap = 4;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  sVar3 = (syntax->items).elements._M_extent._M_extent_value;
  local_210 = 0;
  local_218 = (EVP_PKEY_CTX *)0x0;
  src = extraout_RDX;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)&syntax->items;
  for (; ((SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *)
          elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ != &syntax->items ||
         (elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len != sVar3 + 1 >> 1));
      elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
           elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len + 1) {
    pAVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::
             iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>::dereference
                       ((iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*> *)
                        &elements);
    this = &((pAVar8->key).ptr)->super_SyntaxNode;
    uVar15 = (undefined7)((ulong)unaff_R15 >> 8);
    if (this->kind == DefaultPatternKeyExpression) {
      SVar21 = slang::syntax::SyntaxNode::sourceRange(this);
      ASTContext::addDiag(context,(DiagCode)0xd0007,SVar21);
      unaff_R15 = (EVP_PKEY_CTX *)CONCAT71(uVar15,1);
    }
    else {
      iVar7 = Expression::bind((int)this,(sockaddr *)context,4);
      this_00 = (Expression *)CONCAT44(extraout_var,iVar7);
      bVar6 = Expression::bad(this_00);
      unaff_R15 = (EVP_PKEY_CTX *)CONCAT71(uVar15,1);
      if (!bVar6) {
        if (this_00->kind == DataType) {
          SVar21 = slang::syntax::SyntaxNode::sourceRange(&((pAVar8->key).ptr)->super_SyntaxNode);
          ASTContext::addDiag(context,(DiagCode)0xe0007,SVar21);
        }
        else {
          value = bindArrayIndexSetter
                            (context,this_00,local_1b8,(pAVar8->expr).ptr,&indexMap,
                             &indexSetters.
                              super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                            );
          bVar6 = ASTContext::requirePositive(context,value,this_00->sourceRange);
          if ((bVar6) &&
             (unaff_R15 = local_218,
             local_210 <=
             (ulong)(long)value.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_payload)) {
            local_210 = (long)value.super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int>._M_payload;
          }
        }
      }
    }
    src = (EVP_PKEY_CTX *)((ulong)unaff_R15 & 0xffffffff);
    local_218 = src;
  }
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)elements.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  if (indexMap._184_8_ == local_210 + 1) {
    SmallVectorBase<const_slang::ast::Expression_*>::reserve
              (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,indexMap._184_8_);
    src = extraout_RDX_00;
    for (uVar14 = 0; uVar14 <= local_210; uVar14 = uVar14 + 1) {
      iVar7 = (int)uVar14;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (long)iVar7;
      hash = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
      pos0 = hash >> (indexMap._144_1_ & 0x3f);
      local_208._M_ptr = (pointer)CONCAT44(local_208._M_ptr._4_4_,iVar7);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[hash & 0xff];
      uVar11 = 0;
      uVar10 = pos0;
      do {
        pcVar1 = (char *)(indexMap._160_8_ + uVar10 * 0x10);
        cVar16 = (char)uVar2;
        auVar20[0] = -(*pcVar1 == cVar16);
        cVar17 = (char)((uint)uVar2 >> 8);
        auVar20[1] = -(pcVar1[1] == cVar17);
        cVar18 = (char)((uint)uVar2 >> 0x10);
        auVar20[2] = -(pcVar1[2] == cVar18);
        bVar19 = (byte)((uint)uVar2 >> 0x18);
        auVar20[3] = -(pcVar1[3] == bVar19);
        auVar20[4] = -(pcVar1[4] == cVar16);
        auVar20[5] = -(pcVar1[5] == cVar17);
        auVar20[6] = -(pcVar1[6] == cVar18);
        auVar20[7] = -(pcVar1[7] == bVar19);
        auVar20[8] = -(pcVar1[8] == cVar16);
        auVar20[9] = -(pcVar1[9] == cVar17);
        auVar20[10] = -(pcVar1[10] == cVar18);
        auVar20[0xb] = -(pcVar1[0xb] == bVar19);
        auVar20[0xc] = -(pcVar1[0xc] == cVar16);
        auVar20[0xd] = -(pcVar1[0xd] == cVar17);
        auVar20[0xe] = -(pcVar1[0xe] == cVar18);
        auVar20[0xf] = -(pcVar1[0xf] == bVar19);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
        if (uVar13 != 0) {
          lVar9 = indexMap._168_8_ + uVar10 * 0xf0;
          do {
            iVar4 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
              }
            }
            if (*(int *)(lVar9 + (ulong)(uint)(iVar4 << 4)) == iVar7) {
              ppVar12 = (pair<const_int,_const_slang::ast::Expression_*> *)
                        (lVar9 + (ulong)(uint)(iVar4 << 4));
              goto LAB_003abf20;
            }
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & pcVar1[0xf]) == 0)
        break;
        lVar9 = uVar10 + uVar11;
        uVar11 = uVar11 + 1;
        uVar10 = lVar9 + 1U & indexMap._152_8_;
      } while (uVar11 <= (ulong)indexMap._152_8_);
      if ((ulong)indexMap._184_8_ < (ulong)indexMap._176_8_) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
        ::unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,int>
                  ((locator *)local_1e8,
                   (table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                    *)&indexMap.super_Storage.field_0x88,pos0,hash,(try_emplace_args_t *)&local_1a8,
                   (int *)&local_208);
        ppVar12 = local_1d8;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
        ::unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,int>
                  ((locator *)local_1e8,
                   (table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                    *)&indexMap.super_Storage.field_0x88,hash,(try_emplace_args_t *)&local_1a8,
                   (int *)&local_208);
        ppVar12 = local_1d8;
      }
LAB_003abf20:
      expr = ppVar12->second;
      SmallVectorBase<slang::ast::Expression_const*>::
      emplace_back<slang::ast::Expression_const*const&>
                ((SmallVectorBase<slang::ast::Expression_const*> *)&elements,&expr);
      src = extraout_RDX_01;
    }
  }
  else if (((ulong)local_218 & 1) == 0) {
    local_218 = (EVP_PKEY_CTX *)0x1;
    ASTContext::addDiag(context,(DiagCode)0x140007,sourceRange);
    src = extraout_RDX_02;
  }
  compilation = local_1c0;
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8._8_8_ = 0;
  expr = (mapped_type)0x0;
  _Stack_1f0._M_extent_value = 0;
  iVar7 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::copy
                    (&indexSetters.
                      super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                     ,(EVP_PKEY_CTX *)local_1c0,src);
  local_208._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar7);
  local_1b0 = (void *)0x0;
  iVar7 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,
                     (EVP_PKEY_CTX *)compilation,src_00);
  local_1a8._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar7);
  ctx = local_1c8;
  expr_00 = BumpAllocator::
            emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,18446744073709551615ul>,decltype(nullptr),std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                      (&compilation->super_BumpAllocator,(Type *)local_1c8,
                       (span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                        *)local_1e8,
                       (span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                        *)&expr,&local_208,&local_1b0,&local_1a8,&sourceRange);
  if (((ulong)local_218 & 1) != 0) {
    ctx = expr_00;
    expr_00 = (StructuredAssignmentPatternExpression *)
              Expression::badExpr(compilation,(Expression *)expr_00);
  }
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)ctx);
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::cleanup
            (&indexSetters.
              super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>,
             (EVP_PKEY_CTX *)ctx);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                 *)&indexMap.super_Storage.field_0x88);
  return (Expression *)expr_00;
}

Assistant:

Expression& StructuredAssignmentPatternExpression::forDynamicArray(
    Compilation& comp, const StructuredAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    bool bad = false;
    SmallMap<int32_t, const Expression*, 8> indexMap;
    SmallVector<IndexSetter, 4> indexSetters;
    size_t maxIndex = 0;

    for (auto item : syntax.items) {
        if (item->key->kind == SyntaxKind::DefaultPatternKeyExpression) {
            context.addDiag(diag::AssignmentPatternDynamicDefault, item->key->sourceRange());
            bad = true;
            continue;
        }

        // The key is either an array index or a data type setter.
        auto& keyExpr = Expression::bind(*item->key, context, ASTFlags::AllowDataType);
        if (keyExpr.bad()) {
            bad = true;
            continue;
        }

        if (keyExpr.kind == ExpressionKind::DataType) {
            context.addDiag(diag::AssignmentPatternDynamicType, item->key->sourceRange());
            bad = true;
            continue;
        }

        auto index = bindArrayIndexSetter(context, keyExpr, elementType, *item->expr, indexMap,
                                          indexSetters);
        if (!context.requirePositive(index, keyExpr.sourceRange)) {
            bad = true;
            continue;
        }

        maxIndex = std::max(maxIndex, size_t(*index));
    }

    SmallVector<const Expression*> elements;
    if (indexMap.size() != maxIndex + 1) {
        if (!bad) {
            context.addDiag(diag::AssignmentPatternMissingElements, sourceRange);
            bad = true;
        }
    }
    else {
        elements.reserve(maxIndex + 1);
        for (size_t i = 0; i <= maxIndex; i++) {
            auto expr = indexMap[int32_t(i)];
            SLANG_ASSERT(expr);
            elements.push_back(expr);
        }
    }

    auto result = comp.emplace<StructuredAssignmentPatternExpression>(
        type, std::span<const MemberSetter>{}, std::span<const TypeSetter>{},
        indexSetters.copy(comp), nullptr, elements.copy(comp), sourceRange);

    if (bad)
        return badExpr(comp, result);

    return *result;
}